

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O0

void __thiscall xatlas::internal::ArrayBase::resize(ArrayBase *this,uint32_t newSize,bool exact)

{
  uint32_t local_1c;
  uint32_t newBufferSize;
  bool exact_local;
  uint32_t newSize_local;
  ArrayBase *this_local;
  
  this->size = newSize;
  if (this->capacity < this->size) {
    if ((this->capacity == 0) || (exact)) {
      local_1c = this->size;
    }
    else {
      local_1c = this->size + (this->size >> 2);
    }
    setArrayCapacity(this,local_1c);
  }
  return;
}

Assistant:

void resize(uint32_t newSize, bool exact)
	{
		size = newSize;
		if (size > capacity) {
			// First allocation is always exact. Otherwise, following allocations grow array to 150% of desired size.
			uint32_t newBufferSize;
			if (capacity == 0 || exact)
				newBufferSize = size;
			else
				newBufferSize = size + (size >> 2);
			setArrayCapacity(newBufferSize);
		}
	}